

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

bool Js::RegexHelper::GetFlags
               (ScriptContext *scriptContext,char16 *str,CharCount strLen,RegexFlags *flags)

{
  RegexFlags RVar1;
  RegexFlags RVar2;
  ulong uVar3;
  RegexFlags RVar4;
  bool bVar5;
  bool bVar6;
  
  bVar5 = strLen == 0;
  if (!bVar5) {
    RVar2 = *flags;
    uVar3 = 1;
    do {
      switch((ushort)str[uVar3 - 1] - 0x67 >> 1 |
             (uint)(((ushort)str[uVar3 - 1] - 0x67 & 1) != 0) << 0x1f) {
      case 0:
        RVar1 = GlobalRegexFlag;
        RVar4 = RVar2 & GlobalRegexFlag;
        goto joined_r0x00d4aaac;
      case 1:
        RVar1 = IgnoreCaseRegexFlag;
        RVar4 = RVar2 & IgnoreCaseRegexFlag;
joined_r0x00d4aaac:
        if (RVar4 == NoRegexFlags) goto LAB_00d4aac8;
      default:
        goto switchD_00d4aa59_caseD_2;
      case 3:
        RVar1 = MultilineRegexFlag;
        RVar4 = RVar2 & MultilineRegexFlag;
        break;
      case 6:
        if (((scriptContext->config).threadConfig)->m_ES2018RegExDotAll != true)
        goto switchD_00d4aa59_caseD_2;
        RVar1 = DotAllRegexFlag;
        RVar4 = RVar2 & DotAllRegexFlag;
        break;
      case 7:
        if (((scriptContext->config).threadConfig)->m_ES6Unicode != true)
        goto switchD_00d4aa59_caseD_2;
        RVar1 = UnicodeRegexFlag;
        RVar4 = RVar2 & UnicodeRegexFlag;
        break;
      case 9:
        if (((scriptContext->config).threadConfig)->m_ES6RegExSticky != true)
        goto switchD_00d4aa59_caseD_2;
        RVar1 = StickyRegexFlag;
        RVar4 = RVar2 & StickyRegexFlag;
      }
      if (RVar4 != NoRegexFlags) break;
LAB_00d4aac8:
      RVar2 = RVar2 | RVar1;
      *flags = RVar2;
      bVar5 = strLen <= uVar3;
      bVar6 = uVar3 != strLen;
      uVar3 = uVar3 + 1;
    } while (bVar6);
switchD_00d4aa59_caseD_2:
  }
  return bVar5;
}

Assistant:

bool RegexHelper::GetFlags(Js::ScriptContext* scriptContext, __in_ecount(strLen) const char16* str, CharCount strLen, UnifiedRegex::RegexFlags &flags)
    {
        for (CharCount i = 0; i < strLen; i++)
        {
            switch (str[i])
            {
            case 'i':
                if ((flags & UnifiedRegex::IgnoreCaseRegexFlag) != 0)
                    return false;
                flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & UnifiedRegex::GlobalRegexFlag) != 0)
                    return false;
                flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & UnifiedRegex::MultilineRegexFlag) != 0)
                    return false;
                flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & UnifiedRegex::DotAllRegexFlag) != 0)
                        return false;
                    flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::DotAllRegexFlag);
                    break;
                }
                return false;
            case 'u':
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if((flags & UnifiedRegex::UnicodeRegexFlag) != 0)
                        return false;
                    flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::UnicodeRegexFlag);
                    break;
                }
                return false;
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & UnifiedRegex::StickyRegexFlag) != 0)
                        return false;
                    flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::StickyRegexFlag);
                    break;
                }
                return false;
            default:
                return false;
            }
        }

        return true;
    }